

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O0

void __thiscall TargetImageWidget::paintEvent(TargetImageWidget *this,QPaintEvent *param_1)

{
  QRectF local_70;
  QColor local_50;
  QPen local_40 [8];
  QPen targetAreaPen;
  QBrush local_28 [8];
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  TargetImageWidget *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QBrush::QBrush(local_28,white,SolidPattern);
  QPainter::setBackground((QBrush *)local_20);
  QBrush::~QBrush(local_28);
  PaintImage(this,local_20);
  QPainter::setCompositionMode((CompositionMode)local_20);
  QColor::QColor(&local_50,white);
  QPen::QPen(local_40,&local_50);
  QPen::setWidthF(5.0);
  QPen::setStyle((PenStyle)local_40);
  QPainter::setPen((QPen *)local_20);
  GetTargetRect(&local_70,this);
  QPainter::drawRect(local_20,&local_70);
  QPen::~QPen(local_40);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void TargetImageWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);
    p.setBackground(QBrush(Qt::white));

    PaintImage(p);

    // Draw bounds that need filling
    p.setCompositionMode(QPainter::CompositionMode_Difference);

    QPen targetAreaPen(Qt::white);
    targetAreaPen.setWidthF(qreal{ 5.0 });
    targetAreaPen.setStyle(Qt::PenStyle::DashLine);
    p.setPen(targetAreaPen);

    p.drawRect(GetTargetRect());
}